

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_dump(lua_State *L)

{
  int iVar1;
  undefined1 local_2038 [4];
  int strip;
  luaL_Buffer b;
  lua_State *L_local;
  
  b.initb._8184_8_ = L;
  iVar1 = lua_toboolean(L,2);
  luaL_checktype((lua_State *)b.initb._8184_8_,1,6);
  lua_settop((lua_State *)b.initb._8184_8_,1);
  luaL_buffinit((lua_State *)b.initb._8184_8_,(luaL_Buffer *)local_2038);
  iVar1 = lua_dump((lua_State *)b.initb._8184_8_,writer,local_2038,iVar1);
  if (iVar1 == 0) {
    luaL_pushresult((luaL_Buffer *)local_2038);
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = luaL_error((lua_State *)b.initb._8184_8_,"unable to dump given function");
  }
  return L_local._4_4_;
}

Assistant:

static int str_dump(lua_State *L) {
    luaL_Buffer b;
    int strip = lua_toboolean(L, 2);
    luaL_checktype(L, 1, LUA_TFUNCTION);
    lua_settop(L, 1);
    luaL_buffinit(L, &b);
    if (lua_dump(L, writer, &b, strip) != 0)
        return luaL_error(L, "unable to dump given function");
    luaL_pushresult(&b);
    return 1;
}